

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Clara::Help::Help(Help *this,bool *showHelpFlag)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Opt *pOVar1;
  StringRef optName;
  StringRef optName_00;
  StringRef optName_01;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b1640;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001b1690;
  *(bool **)&this_00[1]._M_use_count = showHelpFlag;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.
  super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_001b24d0;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_optionality = Optional;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_start = "";
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_hint.m_size = 0;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start = "";
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  (this->super_Opt).m_optNames.
  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Opt).m_optNames.
  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Opt).m_optNames.
  super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.
  super_ComposableParserImpl<Catch::Clara::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_001b22e8;
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_start =
       "display usage information";
  (this->super_Opt).super_ParserRefImpl<Catch::Clara::Opt>.m_description.m_size = 0x19;
  optName.m_size = 2;
  optName.m_start = "-?";
  pOVar1 = Opt::operator[](&this->super_Opt,optName);
  optName_00.m_size = 2;
  optName_00.m_start = "-h";
  pOVar1 = Opt::operator[](pOVar1,optName_00);
  optName_01.m_size = 6;
  optName_01.m_start = "--help";
  pOVar1 = Opt::operator[](pOVar1,optName_01);
  (pOVar1->super_ParserRefImpl<Catch::Clara::Opt>).m_optionality = Optional;
  return;
}

Assistant:

Help::Help( bool& showHelpFlag ):
            Opt( [&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            } ) {
            static_cast<Opt&> ( *this )(
                "display usage information" )["-?"]["-h"]["--help"]
                .optional();
        }